

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderConstExprTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ShaderConstExprBuiltinTests::addChildGroup
          (ShaderConstExprBuiltinTests *this,char *name,char *desc,TestParams *cases,int numCases)

{
  Context *pCVar1;
  TestNode *node;
  long lVar2;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderConstExpr::createTests
            (&children,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo,cases,numCases,GLSL_VERSION_100_ES,
             SHADER_BOTH);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,name,desc);
  tcu::TestNode::addChild((TestNode *)this,node);
  if (0 < (int)((ulong)((long)children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar2 = 0;
    do {
      tcu::TestNode::addChild
                (node,children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (int)((ulong)((long)children.
                                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)children.
                                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderConstExprBuiltinTests::addChildGroup (const char* name, const char* desc, const gls::ShaderConstExpr::TestParams* cases, int numCases)
{
	const std::vector<tcu::TestNode*>	children = createTests(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), cases, numCases, glu::GLSL_VERSION_100_ES);
	tcu::TestCaseGroup*					group	 = new tcu::TestCaseGroup(m_testCtx, name, desc);

	addChild(group);

	for (int i = 0; i < (int)children.size(); i++)
		group->addChild(children[i]);
}